

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::utility::operator>>
          (basic_istream<char,_std::char_traits<char>_> *in,ignore_spaces_cl *param_2)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = *(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20);
  while (((iVar1 == 0 && (uVar2 = std::istream::peek(), uVar2 < 0x21)) &&
         ((0x100000600U >> ((ulong)uVar2 & 0x3f) & 1) != 0))) {
    std::istream::get();
    iVar1 = *(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20);
  }
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, const ignore_spaces_cl &) {
        while (in.good()) {
          const auto c{in.peek()};
          if (c == traits_t::eof() or not(c == ' ' or c == '\t' or c == '\n'))
            break;
          in.get();
        }
        return in;
      }